

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O2

bool __thiscall Js::InlineCache::RemoveFromInvalidationList(InlineCache *this)

{
  InlineCache **ppIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  InlineCache **ppIVar5;
  
  ppIVar1 = this->invalidationListSlotPtr;
  if (ppIVar1 != (InlineCache **)0x0) {
    ppIVar5 = ppIVar1;
    if (*ppIVar1 != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                  ,0xdb,"(*this->invalidationListSlotPtr == this)",
                                  "*this->invalidationListSlotPtr == this");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      ppIVar5 = this->invalidationListSlotPtr;
    }
    *ppIVar5 = (InlineCache *)0x0;
    this->invalidationListSlotPtr = (InlineCache **)0x0;
  }
  return ppIVar1 != (InlineCache **)0x0;
}

Assistant:

bool RemoveFromInvalidationList()
        {
            if (this->invalidationListSlotPtr == nullptr)
            {
                return false;
            }

            Assert(*this->invalidationListSlotPtr == this);

            *this->invalidationListSlotPtr = nullptr;
            this->invalidationListSlotPtr = nullptr;

            return true;
        }